

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O3

Byte * __thiscall
CharStringType2Interpreter::InterpretPut
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  size_t *psVar1;
  pointer pCVar2;
  ulong uVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  anon_union_8_2_3d487603_for_CharStringOperand_1 aVar6;
  _List_node_base *p_Var7;
  int iVar8;
  Trace *this_00;
  _List_node_base *p_Var9;
  CharStringOperand valueA;
  
  iVar8 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x25])
                    (this->mImplementationHelper,this);
  if (iVar8 == 0) {
    uVar3 = (this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            _M_size;
    if (uVar3 < 2) {
      this_00 = Trace::DefaultTrace();
      inProgramCounter = (Byte *)0x0;
      Trace::TraceToLog(this_00,
                        "CharStringType2Interpreter::InterpretPut, put should have at least 2 arguments on stack. got %d. aborting"
                        ,(this->mOperandStack).
                         super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
                         _M_impl._M_node._M_size);
    }
    else {
      p_Var4 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      p_Var5 = p_Var4[1]._M_prev;
      p_Var7 = p_Var4[1]._M_next;
      (this->mOperandStack).super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
      _M_impl._M_node._M_size = uVar3 - 1;
      p_Var9 = (_List_node_base *)(long)(double)p_Var5;
      if (((ulong)p_Var7 & 1) != 0) {
        p_Var9 = p_Var5;
      }
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var4,0x20);
      p_Var4 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      p_Var5 = p_Var4[1]._M_next;
      aVar6 = (anon_union_8_2_3d487603_for_CharStringOperand_1)p_Var4[1]._M_prev;
      psVar1 = &(this->mOperandStack).
                super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var4,0x20);
      pCVar2 = (this->mStorage).
               super__Vector_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               super__Vector_impl_data._M_start + (long)p_Var9;
      *(_List_node_base **)pCVar2 = p_Var5;
      pCVar2->field_1 = aVar6;
    }
  }
  else {
    inProgramCounter = (Byte *)0x0;
  }
  return inProgramCounter;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretPut(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Put(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;

	if(mOperandStack.size() < 2) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretPut, put should have at least 2 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}

	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();

	mStorage[(valueB.IsInteger ? valueB.IntegerValue : (long)valueB.RealValue)] = valueA;

	return inProgramCounter;
}